

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<long_double>::~TPZBlockDiagonal(TPZBlockDiagonal<long_double> *this,void **vtt)

{
  TPZVec<long_double> *in_RSI;
  undefined8 *in_RDI;
  void **in_stack_ffffffffffffffd8;
  
  *in_RDI = in_RSI->_vptr_TPZVec;
  TPZVec<int>::~TPZVec((TPZVec<int> *)in_RSI);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_RSI);
  TPZVec<long_double>::~TPZVec(in_RSI);
  TPZMatrix<long_double>::~TPZMatrix((TPZMatrix<long_double> *)in_RSI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::~TPZBlockDiagonal ()
{
}